

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall
TApp_InCaselessSetWithDefault_Test::TestBody(TApp_InCaselessSetWithDefault_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertHelper AStack_128;
  AssertHelper local_120;
  allocator local_115;
  allocator_type local_114;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_113;
  allocator local_112;
  allocator local_111;
  AssertionResult gtest_ar;
  string local_f0 [32];
  string local_d0 [32];
  string choice;
  string local_90;
  string local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  std::__cxx11::string::string((string *)&choice,"one",(allocator *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_70,"-q,--quick",(allocator *)&AStack_128);
  std::__cxx11::string::string((string *)&gtest_ar,"one",(allocator *)&local_120);
  std::__cxx11::string::string(local_f0,"two",&local_111);
  std::__cxx11::string::string(local_d0,"three",&local_112);
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_50,__l,&local_113,&local_114);
  pcVar4 = "";
  std::__cxx11::string::string((string *)&local_90,"",&local_115);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_set_ignore_case
            (this_00,&local_70,&choice,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_50,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_50);
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_70);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"one\"","choice",(char (*) [4])0x1588e8,&choice);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&AStack_128);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x340,pcVar4);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&AStack_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_128);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&gtest_ar,"--quick",(allocator *)&AStack_128);
  std::__cxx11::string::string(local_f0,"tWo",(allocator *)&local_120);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             local_d0);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"two\"","choice",(char (*) [4])0x1583e1,&choice);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&AStack_128);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x346,pcVar4);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&AStack_128);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_128);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&gtest_ar,"--quick",(allocator *)&AStack_128);
  std::__cxx11::string::string(local_f0,"four",(allocator *)&local_120);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             local_d0);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_128,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x34b,
             "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_128,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&AStack_128);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  std::__cxx11::string::~string((string *)&choice);
  return;
}

Assistant:

TEST_F(TApp, InCaselessSetWithDefault) {

    std::string choice = "one";
    app.add_set_ignore_case("-q,--quick", choice, {"one", "two", "three"}, "", true);

    run();
    EXPECT_EQ("one", choice);
    app.reset();

    args = {"--quick", "tWo"};

    run();
    EXPECT_EQ("two", choice);

    app.reset();

    args = {"--quick", "four"};
    EXPECT_THROW(run(), CLI::ConversionError);
}